

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unittest.pb.cc
# Opt level: O3

void __thiscall proto2_unittest::TestOneof2::Clear(TestOneof2 *this)

{
  uint uVar1;
  Arena *arena;
  
  if ((undefined1  [48])((undefined1  [48])this->field_0 & (undefined1  [48])0x1) !=
      (undefined1  [48])0x0) {
    arena = (Arena *)(this->super_Message).super_MessageLite._internal_metadata_.ptr_;
    if (((ulong)arena & 1) != 0) {
      arena = *(Arena **)((ulong)arena & 0xfffffffffffffffe);
    }
    google::protobuf::internal::ArenaStringPtr::ClearToDefault
              (&(this->field_0)._impl_.baz_string_,
               (LazyString *)Impl_::_i_give_permission_to_break_this_code_default_baz_string_,arena)
    ;
  }
  (this->field_0)._impl_.baz_int_ = 0;
  clear_foo(this);
  uVar1 = (this->field_0)._impl_._oneof_case_[1];
  if ((uVar1 < 0x18) && ((0xf1e000U >> (uVar1 & 0x1f) & 1) != 0)) {
    google::protobuf::internal::ArenaStringPtr::Destroy(&(this->field_0)._impl_.bar_.bar_string_);
  }
  (this->field_0)._impl_._oneof_case_[1] = 0;
  (this->field_0)._impl_._has_bits_.has_bits_[0] = 0;
  if (((this->super_Message).super_MessageLite._internal_metadata_.ptr_ & 1) == 0) {
    return;
  }
  google::protobuf::internal::InternalMetadata::DoClear<google::protobuf::UnknownFieldSet>
            (&(this->super_Message).super_MessageLite._internal_metadata_);
  return;
}

Assistant:

PROTOBUF_NOINLINE void TestOneof2::Clear() {
// @@protoc_insertion_point(message_clear_start:proto2_unittest.TestOneof2)
  ::google::protobuf::internal::TSanWrite(&_impl_);
  ::uint32_t cached_has_bits = 0;
  // Prevent compiler warnings about cached_has_bits being unused
  (void) cached_has_bits;

  cached_has_bits = _impl_._has_bits_[0];
  if ((cached_has_bits & 0x00000001u) != 0) {
    _impl_.baz_string_.ClearToDefault(::proto2_unittest::TestOneof2::Impl_::_i_give_permission_to_break_this_code_default_baz_string_, GetArena());
  }
  _impl_.baz_int_ = 0;
  clear_foo();
  clear_bar();
  _impl_._has_bits_.Clear();
  _internal_metadata_.Clear<::google::protobuf::UnknownFieldSet>();
}